

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O2

bool __thiscall
wasm::LoopInvariantCodeMotion::hasGetDependingOnLoopSet
          (LoopInvariantCodeMotion *this,Expression *curr,LoopSets *loopSets)

{
  bool bVar1;
  size_type sVar2;
  LocalSet **ppLVar3;
  _Rb_tree_const_iterator<wasm::LocalSet_*> _Var4;
  undefined1 local_a0 [8];
  Iterator __end3;
  FindAll<wasm::LocalGet> gets;
  LocalSet *set;
  undefined1 local_58 [8];
  Iterator __begin3;
  
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&__end3.flexibleIterator,curr);
  __begin3.flexibleIterator._M_node =
       (_Base_ptr)
       gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var4 = __end3.flexibleIterator; _Var4._M_node != __begin3.flexibleIterator._M_node;
      _Var4._M_node = (_Base_ptr)&(_Var4._M_node)->_M_parent) {
    local_58 = (undefined1  [8])
               LazyLocalGraph::getSets(this->localGraph,*(LocalGet **)_Var4._M_node);
    __begin3.fixedIndex = 0;
    __begin3.parent._0_1_ =
         (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            *)local_58)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    if ((bool)(char)__begin3.parent) {
      __begin3.usingFixed = false;
      __begin3._9_7_ = 0;
    }
    else {
      __begin3.fixedIndex =
           (size_t)(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                      *)local_58)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::end((Iterator *)local_a0,
          (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
           *)local_58);
    while (bVar1 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   ::
                   IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                   ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                 *)local_58,(Iterator *)local_a0), bVar1) {
      ppLVar3 = (LocalSet **)(__begin3.fixedIndex + 0x20);
      if ((char)__begin3.parent != '\0') {
        ppLVar3 = (((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)local_58)->
                  super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems + __begin3._8_8_;
      }
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppLVar3;
      if (((LocalSet *)
           gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage != (LocalSet *)0x0) &&
         (sVar2 = std::
                  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&loopSets->_M_h,
                          (key_type *)
                          &gets.list.
                           super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage), sVar2 != 0))
      goto LAB_00a7e4b9;
      SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ::
      IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
      ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    *)local_58);
    }
  }
LAB_00a7e4b9:
  bVar1 = _Var4._M_node != __begin3.flexibleIterator._M_node;
  std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
             &__end3.flexibleIterator);
  return bVar1;
}

Assistant:

bool hasGetDependingOnLoopSet(Expression* curr, LoopSets& loopSets) {
    FindAll<LocalGet> gets(curr);
    for (auto* get : gets.list) {
      auto& sets = localGraph->getSets(get);
      for (auto* set : sets) {
        // nullptr means a parameter or zero-init value;
        // no danger to us.
        if (!set) {
          continue;
        }
        // Check if the set is in the loop. If not, it's either before,
        // which is fine, or after, which is also fine - moving curr
        // to just outside the loop will preserve those relationships.
        // TODO: this still counts curr's sets as inside the loop, which
        //       might matter in non-flat mode.
        if (loopSets.count(set)) {
          return true;
        }
      }
    }
    return false;
  }